

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O0

void check_variant_empty<type_safe::basic_variant<type_safe::optional_variant_policy,int,evil_variant_test_type>>
               (basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type> *var)

{
  IResultCapture *pIVar1;
  bool bVar2;
  union_type<int> local_381;
  basic_optional<type_safe::reference_optional_storage<const_int,_false>_> local_380;
  Decomposer local_372;
  ExprLhs<bool> local_371;
  StringRef local_370;
  SourceLineInfo local_360;
  StringRef local_350;
  undefined1 local_340 [8];
  AssertionHandler catchAssertionHandler_5;
  undefined1 local_2f0 [16];
  ExprLhs<const_type_safe::basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>_&>
  local_2e0;
  StringRef local_2d8;
  SourceLineInfo local_2c8;
  StringRef local_2b8;
  undefined1 local_2a8 [8];
  AssertionHandler catchAssertionHandler_4;
  undefined1 auStack_258 [4];
  nullvar_t null;
  SourceLineInfo local_248;
  StringRef local_238;
  undefined1 local_228 [8];
  AssertionHandler catchAssertionHandler_3;
  Decomposer local_1d1;
  type_id *local_1d0;
  BinaryExpr<const_type_safe::tagged_union<int,_evil_variant_test_type>::type_id_&,_const_type_safe::tagged_union<int,_evil_variant_test_type>::type_id_&>
  local_1c8;
  StringRef local_198;
  SourceLineInfo local_188;
  StringRef local_178;
  undefined1 local_168 [8];
  AssertionHandler catchAssertionHandler_2;
  StringRef local_118;
  SourceLineInfo local_108;
  StringRef local_f8;
  undefined1 local_e8 [8];
  AssertionHandler catchAssertionHandler_1;
  Decomposer local_8a;
  ExprLhs<bool> local_89;
  StringRef local_88;
  SourceLineInfo local_78;
  StringRef local_68;
  undefined1 local_58 [8];
  AssertionHandler catchAssertionHandler;
  basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type> *var_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)var;
  local_68 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x1c);
  Catch::StringRef::StringRef(&local_88,"!var.has_value()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_58,&local_68,&local_78,local_88,Normal);
  bVar2 = type_safe::basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>
          ::has_value((basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>
                       *)catchAssertionHandler.m_resultCapture);
  local_89 = Catch::Decomposer::operator<=(&local_8a,!bVar2);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_58,&local_89);
  Catch::AssertionHandler::complete((AssertionHandler *)local_58);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_58);
  local_f8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x1d);
  Catch::StringRef::StringRef(&local_118,"!var");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_e8,&local_f8,&local_108,local_118,Normal);
  bVar2 = type_safe::basic_variant::operator_cast_to_bool
                    ((basic_variant *)catchAssertionHandler.m_resultCapture);
  catchAssertionHandler_2.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_2.m_resultCapture + 6),!bVar2);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_e8,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_2.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_e8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_e8);
  local_178 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x20);
  Catch::StringRef::StringRef(&local_198,"var.type() == Variant::invalid_type");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_168,&local_178,&local_188,local_198,Normal);
  catchAssertionHandler_3.m_resultCapture =
       (IResultCapture *)
       type_safe::basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>::
       type((basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type> *)
            catchAssertionHandler.m_resultCapture);
  local_1d0 = (type_id *)
              Catch::Decomposer::operator<=
                        (&local_1d1,(type_id *)&catchAssertionHandler_3.m_resultCapture);
  Catch::ExprLhs<type_safe::tagged_union<int,evil_variant_test_type>::type_id_const&>::operator==
            (&local_1c8,
             (ExprLhs<type_safe::tagged_union<int,evil_variant_test_type>::type_id_const&> *)
             &local_1d0,
             &type_safe::
              basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>::
              invalid_type);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_168,&local_1c8.super_ITransientExpression);
  Catch::
  BinaryExpr<const_type_safe::tagged_union<int,_evil_variant_test_type>::type_id_&,_const_type_safe::tagged_union<int,_evil_variant_test_type>::type_id_&>
  ::~BinaryExpr(&local_1c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_168);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_168);
  local_238 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x21);
  Catch::StringRef::StringRef((StringRef *)auStack_258,"var.has_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_228,&local_238,&local_248,_auStack_258,Normal);
  pIVar1 = catchAssertionHandler.m_resultCapture;
  type_safe::union_type<type_safe::nullvar_t>::union_type
            ((union_type<type_safe::nullvar_t> *)
             ((long)&catchAssertionHandler_4.m_resultCapture + 5));
  bVar2 = type_safe::basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>
          ::has_value((basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>
                       *)pIVar1);
  catchAssertionHandler_4.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_4.m_resultCapture + 6),bVar2);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_228,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_4.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_228);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_228);
  pIVar1 = catchAssertionHandler.m_resultCapture;
  type_safe::union_type<type_safe::nullvar_t>::union_type
            ((union_type<type_safe::nullvar_t> *)
             ((long)&catchAssertionHandler_4.m_resultCapture + 3));
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>::value
            ((basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type> *)
             pIVar1);
  local_2b8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2c8,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x29);
  Catch::StringRef::StringRef(&local_2d8,"var.optional_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2a8,&local_2b8,&local_2c8,local_2d8,Normal);
  pIVar1 = catchAssertionHandler.m_resultCapture;
  type_safe::union_type<type_safe::nullvar_t>::union_type
            ((union_type<type_safe::nullvar_t> *)
             ((long)&catchAssertionHandler_5.m_resultCapture + 7));
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>::
  optional_value((basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type> *)
                 local_2f0,pIVar1);
  local_2e0 = Catch::Decomposer::operator<=
                        ((Decomposer *)(local_2f0 + 0xf),
                         (basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>
                          *)local_2f0);
  Catch::AssertionHandler::
  handleExpr<type_safe::basic_optional<type_safe::reference_optional_storage<type_safe::nullvar_t_const,false>>const&>
            ((AssertionHandler *)local_2a8,&local_2e0);
  type_safe::
  basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>::
  ~basic_optional((basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>
                   *)local_2f0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2a8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2a8);
  local_350 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_360,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x2a);
  Catch::StringRef::StringRef(&local_370,"!var.optional_value(variant_type<int>{})");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_340,&local_350,&local_360,local_370,Normal);
  pIVar1 = catchAssertionHandler.m_resultCapture;
  type_safe::union_type<int>::union_type(&local_381);
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>::
  optional_value<int>((basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>
                       *)&local_380,pIVar1);
  bVar2 = type_safe::basic_optional::operator_cast_to_bool((basic_optional *)&local_380);
  local_371 = Catch::Decomposer::operator<=(&local_372,!bVar2);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_340,&local_371);
  type_safe::basic_optional<type_safe::reference_optional_storage<const_int,_false>_>::
  ~basic_optional(&local_380);
  Catch::AssertionHandler::complete((AssertionHandler *)local_340);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_340);
  return;
}

Assistant:

void check_variant_empty(const Variant& var)
{
    // boolean queries
    REQUIRE(!var.has_value());
    REQUIRE(!var);

    // type queries
    REQUIRE(var.type() == Variant::invalid_type);
    REQUIRE(var.has_value(variant_type<nullvar_t>{}));

    // value query
    // (check that it compiles and does not abort)
    nullvar_t null = var.value(variant_type<nullvar_t>{});
    (void)null;

    // optional_value queries
    REQUIRE(var.optional_value(variant_type<nullvar_t>{}));
    REQUIRE(!var.optional_value(variant_type<int>{}));
}